

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::Test::Run(Test *this)

{
  UnitTestImpl *this_00;
  bool bVar1;
  OsStackTraceGetterInterface *pOVar2;
  
  bVar1 = HasSameFixtureClass();
  if (bVar1) {
    UnitTest::GetInstance();
    this_00 = UnitTest::GetInstance::instance.impl_;
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(UnitTest::GetInstance::instance.impl_);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x11,(char *)0x0);
    bVar1 = HasFatalFailure();
    if (!bVar1) {
      pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
      (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x21,(char *)0x0);
    }
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x19,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void Test::Run() {
  if (!HasSameFixtureClass()) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(this, &Test::SetUp, "SetUp()");
  // We will run the test only if SetUp() was successful.
  if (!HasFatalFailure()) {
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        this, &Test::TestBody, "the test body");
  }

  // However, we want to clean up as much as possible.  Hence we will
  // always call TearDown(), even if SetUp() or the test body has
  // failed.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &Test::TearDown, "TearDown()");
}